

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O0

void i_string_suite::i_string_invalid_lonely_surrogate(void)

{
  undefined4 local_1bc;
  value local_1b8 [2];
  view_type local_1b0;
  undefined4 local_198;
  value local_194 [6];
  undefined4 local_17c;
  value local_178 [2];
  basic_string_view<char,_std::char_traits<char>_> local_170;
  undefined1 local_160 [8];
  reader reader;
  char input [11];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_7_ = 0x303864755c225b;
  stack0xffffffffffffffef = 0x5d2230;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_170,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_160,&local_170);
  local_178[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_17c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x108,"void i_string_suite::i_string_invalid_lonely_surrogate()",local_178,&local_17c)
  ;
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_194[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_198 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x10a,"void i_string_suite::i_string_invalid_lonely_surrogate()",local_194,&local_198)
  ;
  local_1b0 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[9]>
            ("reader.literal()","\"\\\"\\\\ud800\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x10b,"void i_string_suite::i_string_invalid_lonely_surrogate()",&local_1b0,
             "\"\\ud800\"");
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_1b8[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_1bc = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x10d,"void i_string_suite::i_string_invalid_lonely_surrogate()",local_1b8,&local_1bc)
  ;
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_160);
  return;
}

Assistant:

void i_string_invalid_lonely_surrogate()
{
    const char input[] = "[\"\\ud800\"]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "\"\\ud800\""); // No knowledge of surrogates
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
}